

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RandomUniformStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformstatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4ab) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ab;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
    RandomUniformStaticLayerParams::RandomUniformStaticLayerParams(this_00.randomuniformstatic_);
    (this->layer_).randomuniformstatic_ = (RandomUniformStaticLayerParams *)this_00;
  }
  return (RandomUniformStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformStaticLayerParams* NeuralNetworkLayer::mutable_randomuniformstatic() {
  if (!has_randomuniformstatic()) {
    clear_layer();
    set_has_randomuniformstatic();
    layer_.randomuniformstatic_ = new ::CoreML::Specification::RandomUniformStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomUniformStatic)
  return layer_.randomuniformstatic_;
}